

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

prerelease_identifier * __thiscall
semver::detail::version_parser::make_prerelease_identifier
          (prerelease_identifier *__return_storage_ptr__,version_parser *this,string *identifier)

{
  byte bVar1;
  prerelease_identifier_type pVar2;
  size_type sVar3;
  
  pVar2 = numeric;
  sVar3 = 0;
  do {
    if (identifier->_M_string_length == sVar3) goto LAB_0014cab5;
    bVar1 = (identifier->_M_dataplus)._M_p[sVar3];
  } while ((bVar1 != 0x2d) && (sVar3 = sVar3 + 1, (byte)((bVar1 & 0xdf) + 0xa5) < 0xe6));
  pVar2 = alphanumeric;
LAB_0014cab5:
  __return_storage_ptr__->type = pVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->identifier,(string *)identifier);
  return __return_storage_ptr__;
}

Assistant:

SEMVER_CONSTEXPR detail::prerelease_identifier make_prerelease_identifier(const std::string& identifier) {
    auto type = detail::prerelease_identifier_type::numeric;
    for (char c : identifier) {
      if (c == '-' || detail::is_letter(c)) {
        type = detail::prerelease_identifier_type::alphanumeric;
        break;
      }
    }
    return detail::prerelease_identifier{ type, identifier };
  }